

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_Error tt_cmap0_validate(FT_Byte *table,FT_Validator valid)

{
  ushort uVar1;
  long lVar2;
  
  if (valid->limit < table + 4) {
    ft_validator_error(valid,8);
  }
  uVar1 = *(ushort *)(table + 2) << 8 | *(ushort *)(table + 2) >> 8;
  if ((uVar1 < 0x106) || (valid->limit < table + uVar1)) {
    ft_validator_error(valid,8);
  }
  if (valid->level != FT_VALIDATE_DEFAULT) {
    lVar2 = 0;
    do {
      if ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <= (uint)table[lVar2 + 6]) {
        ft_validator_error(valid,0x10);
      }
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 0x100);
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap0_validate( FT_Byte*      table,
                     FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_UInt   length;


    if ( table + 2 + 2 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p      = table + 2;           /* skip format */
    length = TT_NEXT_USHORT( p );

    if ( table + length > valid->limit || length < 262 )
      FT_INVALID_TOO_SHORT;

    /* check glyph indices whenever necessary */
    if ( valid->level >= FT_VALIDATE_TIGHT )
    {
      FT_UInt  n, idx;


      p = table + 6;
      for ( n = 0; n < 256; n++ )
      {
        idx = *p++;
        if ( idx >= TT_VALID_GLYPH_COUNT( valid ) )
          FT_INVALID_GLYPH_ID;
      }
    }

    return FT_Err_Ok;
  }